

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldActivator.cpp
# Opt level: O3

XPathMatcher * __thiscall
xercesc_4_0::FieldActivator::activateField(FieldActivator *this,IC_Field *field,int initialDepth)

{
  RefHash2KeysTableOf<xercesc_4_0::ValueStore,_xercesc_4_0::PtrHasher> *pRVar1;
  XPathMatcherStack *pXVar2;
  BaseRefVectorOf<xercesc_4_0::XPathMatcher> *this_00;
  XMLSize_t XVar3;
  RefHash2KeysTableBucketElem<xercesc_4_0::ValueStore> *pRVar4;
  XPathMatcher *pXVar5;
  ValueStore *valueStore;
  bool local_19;
  
  pRVar1 = this->fValueStoreCache->fIC2ValueStoreMap;
  valueStore = (ValueStore *)0x0;
  pRVar4 = pRVar1->fBucketList[(ulong)field->fIdentityConstraint % pRVar1->fHashModulus];
  if (pRVar4 != (RefHash2KeysTableBucketElem<xercesc_4_0::ValueStore> *)0x0) {
    valueStore = (ValueStore *)0x0;
    do {
      if ((pRVar4->fKey2 == initialDepth) &&
         ((IdentityConstraint *)pRVar4->fKey1 == field->fIdentityConstraint)) {
        valueStore = pRVar4->fData;
        break;
      }
      pRVar4 = pRVar4->fNext;
    } while (pRVar4 != (RefHash2KeysTableBucketElem<xercesc_4_0::ValueStore> *)0x0);
  }
  pXVar5 = IC_Field::createMatcher(field,this,valueStore,this->fMemoryManager);
  local_19 = true;
  ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::put(this->fMayMatch,field,&local_19);
  pXVar2 = this->fMatcherStack;
  this_00 = &pXVar2->fMatchers->super_BaseRefVectorOf<xercesc_4_0::XPathMatcher>;
  if (this_00->fCurCount == (ulong)pXVar2->fMatchersCount) {
    BaseRefVectorOf<xercesc_4_0::XPathMatcher>::ensureExtraCapacity(this_00,1);
    XVar3 = this_00->fCurCount;
    this_00->fElemList[XVar3] = pXVar5;
    this_00->fCurCount = XVar3 + 1;
    pXVar2->fMatchersCount = pXVar2->fMatchersCount + 1;
  }
  else {
    pXVar2->fMatchersCount = pXVar2->fMatchersCount + 1;
    (*this_00->_vptr_BaseRefVectorOf[2])(this_00,pXVar5);
  }
  (*pXVar5->_vptr_XPathMatcher[3])(pXVar5);
  return pXVar5;
}

Assistant:

XPathMatcher* FieldActivator::activateField(IC_Field* const field, const int initialDepth) {

    ValueStore* valueStore = fValueStoreCache->getValueStoreFor(field, initialDepth);
    XPathMatcher* matcher = field->createMatcher(this, valueStore, fMemoryManager);

    setMayMatch(field, true);
    fMatcherStack->addMatcher(matcher);
    matcher->startDocumentFragment();

    return matcher;
}